

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# passes.hpp
# Opt level: O0

Program __thiscall DeadCodeElimination::run(DeadCodeElimination *this,Program *program)

{
  bool bVar1;
  Function *pFVar2;
  vector<const_Type_*,_std::allocator<const_Type_*>_> *argument_types;
  Type *return_type;
  mapped_type *ppFVar3;
  Block *pBVar4;
  Block *source_block;
  Function *extraout_RDX;
  Function *extraout_RDX_00;
  Program PVar5;
  undefined1 local_e0 [8];
  UsageTable usage_table;
  Function *new_function_1;
  Function *function_1;
  Iterator __end1_1;
  Iterator __begin1_1;
  Program *__range1_1;
  Function *new_function;
  Function *function;
  Iterator __end1;
  Iterator local_60;
  Iterator __begin1;
  Program *__range1;
  FunctionTable function_table;
  Program *program_local;
  Program *new_program;
  
  function_table._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ = 0;
  Program::Program((Program *)this);
  std::
  map<const_Function_*,_Function_*,_std::less<const_Function_*>,_std::allocator<std::pair<const_Function_*const,_Function_*>_>_>
  ::map((map<const_Function_*,_Function_*,_std::less<const_Function_*>,_std::allocator<std::pair<const_Function_*const,_Function_*>_>_>
         *)&__range1);
  __begin1.function = (Function *)program;
  local_60 = Program::begin(program);
  function = (Function *)Program::end(__begin1.function);
  while( true ) {
    bVar1 = Program::Iterator::operator!=(&local_60,(Iterator *)&function);
    if (!bVar1) break;
    new_function = Program::Iterator::operator*(&local_60);
    pFVar2 = (Function *)operator_new(0x60);
    argument_types = Function::get_argument_types(new_function);
    return_type = Function::get_return_type(new_function);
    Function::Function(pFVar2,argument_types,return_type);
    Program::add_function((Program *)this,pFVar2);
    ppFVar3 = std::
              map<const_Function_*,_Function_*,_std::less<const_Function_*>,_std::allocator<std::pair<const_Function_*const,_Function_*>_>_>
              ::operator[]((map<const_Function_*,_Function_*,_std::less<const_Function_*>,_std::allocator<std::pair<const_Function_*const,_Function_*>_>_>
                            *)&__range1,&new_function);
    *ppFVar3 = pFVar2;
    Program::Iterator::operator++(&local_60);
  }
  __end1_1 = Program::begin(program);
  function_1 = (Function *)Program::end(program);
  while( true ) {
    bVar1 = Program::Iterator::operator!=(&__end1_1,(Iterator *)&function_1);
    if (!bVar1) break;
    new_function_1 = Program::Iterator::operator*(&__end1_1);
    ppFVar3 = std::
              map<const_Function_*,_Function_*,_std::less<const_Function_*>,_std::allocator<std::pair<const_Function_*const,_Function_*>_>_>
              ::operator[]((map<const_Function_*,_Function_*,_std::less<const_Function_*>,_std::allocator<std::pair<const_Function_*const,_Function_*>_>_>
                            *)&__range1,&new_function_1);
    usage_table._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)*ppFVar3;
    std::
    map<const_Expression_*,_bool,_std::less<const_Expression_*>,_std::allocator<std::pair<const_Expression_*const,_bool>_>_>
    ::map((map<const_Expression_*,_bool,_std::less<const_Expression_*>,_std::allocator<std::pair<const_Expression_*const,_bool>_>_>
           *)local_e0);
    pBVar4 = Function::get_block(new_function_1);
    Mark::evaluate((map<const_Expression_*,_bool,_std::less<const_Expression_*>,_std::allocator<std::pair<const_Expression_*const,_bool>_>_>
                    *)local_e0,pBVar4);
    pBVar4 = Function::get_block((Function *)
                                 usage_table._M_t._M_impl.super__Rb_tree_header._M_node_count);
    source_block = Function::get_block(new_function_1);
    Sweep::evaluate((FunctionTable *)&__range1,(UsageTable *)local_e0,pBVar4,source_block);
    std::
    map<const_Expression_*,_bool,_std::less<const_Expression_*>,_std::allocator<std::pair<const_Expression_*const,_bool>_>_>
    ::~map((map<const_Expression_*,_bool,_std::less<const_Expression_*>,_std::allocator<std::pair<const_Expression_*const,_bool>_>_>
            *)local_e0);
    Program::Iterator::operator++(&__end1_1);
  }
  function_table._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ = 1;
  std::
  map<const_Function_*,_Function_*,_std::less<const_Function_*>,_std::allocator<std::pair<const_Function_*const,_Function_*>_>_>
  ::~map((map<const_Function_*,_Function_*,_std::less<const_Function_*>,_std::allocator<std::pair<const_Function_*const,_Function_*>_>_>
          *)&__range1);
  pFVar2 = extraout_RDX;
  if ((function_table._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ & 1) == 0) {
    Program::~Program((Program *)this);
    pFVar2 = extraout_RDX_00;
  }
  PVar5.last = pFVar2;
  PVar5.first = (Function *)this;
  return PVar5;
}

Assistant:

static Program run(const Program& program) {
		Program new_program;
		FunctionTable function_table;
		for (const Function* function: program) {
			Function* new_function = new Function(function->get_argument_types(), function->get_return_type());
			new_program.add_function(new_function);
			function_table[function] = new_function;
		}
		for (const Function* function: program) {
			Function* new_function = function_table[function];
			UsageTable usage_table;
			Mark::evaluate(usage_table, function->get_block());
			Sweep::evaluate(function_table, usage_table, new_function->get_block(), function->get_block());
		}
		return new_program;
	}